

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void __thiscall rw::Image::free(Image *this,void *__ptr)

{
  if ((this->flags & 1) != 0) {
    (*DAT_00149de0)(this->pixels);
    this->pixels = (uint8 *)0x0;
  }
  if ((this->flags & 2) != 0) {
    (*DAT_00149de0)(this->palette);
    this->palette = (uint8 *)0x0;
  }
  this->flags = 0;
  return;
}

Assistant:

void
Image::free(void)
{
	if(this->flags&1){
		rwFree(this->pixels);
		this->pixels = nil;
	}
	if(this->flags&2){
		rwFree(this->palette);
		this->palette = nil;
	}
	this->flags = 0;
}